

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O2

ssize_t __thiscall Omega_h::vtk::FullWriter::write(FullWriter *this,int __fd,void *__buf,size_t __n)

{
  Writer *pWVar1;
  ssize_t in_RAX;
  void *extraout_RDX;
  Writer *writer;
  Writer *this_00;
  
  pWVar1 = (this->writers_).
           super__Vector_base<Omega_h::vtk::Writer,_std::allocator<Omega_h::vtk::Writer>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->writers_).
                 super__Vector_base<Omega_h::vtk::Writer,_std::allocator<Omega_h::vtk::Writer>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pWVar1; this_00 = this_00 + 1)
  {
    in_RAX = Writer::write(this_00,__fd,__buf,__n);
    __buf = extraout_RDX;
  }
  return in_RAX;
}

Assistant:

void FullWriter::write(Real time) {
  for (auto& writer : writers_) writer.write(time);
}